

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_or_listen_error_after_close(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *unaff_RBX;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  code *pcStack_478;
  long lStack_470;
  long lStack_468;
  long alStack_460 [13];
  undefined1 auStack_3f8 [232];
  long alStack_310 [64];
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [232];
  
  pcStack_110 = (code *)0x1b05ed;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1b05fc;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    unaff_RBX = local_f0;
    pcStack_110 = (code *)0x1b062b;
    uv_close(unaff_RBX,0);
    pcStack_110 = (code *)0x1b063a;
    iVar1 = uv_pipe_bind(unaff_RBX,"/tmp/uv-test-sock");
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001b0725;
    pcStack_110 = (code *)0x1b066b;
    iVar1 = uv_listen(local_f0,0x1000,0);
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001b0734;
    pcStack_110 = (code *)0x1b0690;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b069a;
    iVar1 = uv_run(uVar2,0);
    local_f8 = (long)iVar1;
    local_100 = 0;
    if (local_f8 != 0) goto LAB_001b0743;
    pcStack_110 = (code *)0x1b06bf;
    unaff_RBX = (undefined1 *)uv_default_loop();
    pcStack_110 = (code *)0x1b06d3;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1b06dd;
    uv_run(unaff_RBX,0);
    local_f8 = 0;
    pcStack_110 = (code *)0x1b06eb;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b06f3;
    iVar1 = uv_loop_close(uVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      pcStack_110 = (code *)0x1b070b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1b0725;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b0725:
    pcStack_110 = (code *)0x1b0734;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b0734:
    pcStack_110 = (code *)0x1b0743;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b0743:
    pcStack_110 = (code *)0x1b0752;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_110 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar3 = &lStack_470;
  pcStack_478 = (code *)0x1b076e;
  pcStack_110 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_478 = (code *)0x1b077d;
  iVar1 = uv_pipe_init(uVar2,auStack_3f8,0);
  alStack_310[0] = (long)iVar1;
  alStack_460[0] = 0;
  if (alStack_310[0] == 0) {
    pcStack_478 = (code *)0x1b07bd;
    memset(alStack_310,0x40,0x200);
    alStack_460[0] = -0x24;
    pcStack_478 = (code *)0x1b07dd;
    iVar1 = uv_pipe_bind2(auStack_3f8,alStack_310,0x200,1);
    lStack_470 = (long)iVar1;
    if (alStack_460[0] != lStack_470) goto LAB_001b0991;
    lStack_470 = -0x24;
    pcStack_478 = (code *)0x1b0823;
    iVar1 = uv_pipe_connect2(alStack_460,auStack_3f8,alStack_310,0x200,1,abort);
    lStack_468 = (long)iVar1;
    if (lStack_470 != lStack_468) goto LAB_001b099e;
    pcStack_478 = (code *)0x1b083e;
    uVar2 = uv_default_loop();
    pcStack_478 = (code *)0x1b0848;
    iVar1 = uv_run(uVar2,0);
    lStack_470 = (long)iVar1;
    lStack_468 = 0;
    if (lStack_470 != 0) goto LAB_001b09ab;
    lStack_470 = -0x16;
    pcStack_478 = (code *)0x1b087f;
    iVar1 = uv_pipe_bind(auStack_3f8,"");
    lStack_468 = (long)iVar1;
    if (lStack_470 != lStack_468) goto LAB_001b09b8;
    pcStack_478 = (code *)0x1b08b2;
    uv_pipe_connect(alStack_460,auStack_3f8,"",connect_overlong_cb);
    pcStack_478 = (code *)0x1b08b7;
    uVar2 = uv_default_loop();
    pcStack_478 = (code *)0x1b08c1;
    iVar1 = uv_run(uVar2,0);
    lStack_470 = (long)iVar1;
    lStack_468 = 0;
    if (lStack_470 != 0) goto LAB_001b09c5;
    lStack_470 = 1;
    lStack_468 = (long)connect_cb_called;
    if (lStack_468 != 1) goto LAB_001b09d2;
    lStack_470 = 1;
    lStack_468 = (long)close_cb_called;
    if (lStack_468 == 1) {
      pcStack_478 = (code *)0x1b092a;
      uVar2 = uv_default_loop();
      pcStack_478 = (code *)0x1b093e;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_478 = (code *)0x1b0948;
      uv_run(uVar2,0);
      lStack_470 = 0;
      pcStack_478 = (code *)0x1b0955;
      uVar2 = uv_default_loop();
      pcStack_478 = (code *)0x1b095d;
      iVar1 = uv_loop_close(uVar2);
      lStack_468 = (long)iVar1;
      if (lStack_470 == lStack_468) {
        pcStack_478 = (code *)0x1b0974;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b09ec;
    }
  }
  else {
    pcStack_478 = (code *)0x1b0991;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0991:
    pcStack_478 = (code *)0x1b099e;
    run_test_pipe_overlong_path_cold_2();
LAB_001b099e:
    pcStack_478 = (code *)0x1b09ab;
    run_test_pipe_overlong_path_cold_3();
LAB_001b09ab:
    pcStack_478 = (code *)0x1b09b8;
    run_test_pipe_overlong_path_cold_4();
LAB_001b09b8:
    pcStack_478 = (code *)0x1b09c5;
    run_test_pipe_overlong_path_cold_5();
LAB_001b09c5:
    pcStack_478 = (code *)0x1b09d2;
    run_test_pipe_overlong_path_cold_6();
LAB_001b09d2:
    pcStack_478 = (code *)0x1b09df;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_478 = (code *)0x1b09ec;
  run_test_pipe_overlong_path_cold_8();
LAB_001b09ec:
  iVar1 = (int)&lStack_468;
  pcStack_478 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_478 = (code *)(long)iVar1;
  if (pcStack_478 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_478;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_or_listen_error_after_close) {
  uv_pipe_t server;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &server, 0));
  uv_close((uv_handle_t*) &server, NULL);

  ASSERT_EQ(uv_pipe_bind(&server, TEST_PIPENAME), UV_EINVAL);

  ASSERT_EQ(uv_listen((uv_stream_t*) &server, SOMAXCONN, NULL), UV_EINVAL);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}